

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::date_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneMinuteOperator>>
               (date_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  Vector VVar1;
  date_t dVar2;
  unsigned_long *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long *plVar5;
  undefined8 *puVar6;
  int64_t *piVar7;
  timestamp_t *ptVar8;
  byte bVar9;
  optional_idx oVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  _Head_base<0UL,_unsigned_long_*,_false> _Var12;
  _Head_base<0UL,_unsigned_long_*,_false> _Var13;
  element_type *peVar14;
  bool bVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  _Head_base<0UL,_unsigned_long_*,_false> _Var17;
  ulong uVar18;
  VectorBuffer *pVVar19;
  idx_t iVar20;
  SelectionVector *pSVar21;
  ulong extraout_RDX;
  UnifiedVectorFormat *count_00;
  Vector *args;
  ulong uVar22;
  Vector *vector;
  VectorType VVar23;
  ulong uVar24;
  undefined1 adds_nulls_00;
  ValidityMask *pVVar25;
  ValidityMask *pVVar26;
  char cVar27;
  _Head_base<0UL,_unsigned_long_*,_false> *p_Var28;
  Vector *pVVar29;
  idx_t idx_in_entry;
  Vector *pVVar30;
  Vector *pVVar31;
  ValidityMask *this;
  Vector *pVVar32;
  unsigned_long uVar33;
  optional_idx oStack_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_170;
  ValidityMask VStack_168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_138;
  unsigned_long uStack_128;
  _Head_base<0UL,_unsigned_long_*,_false> *p_Stack_120;
  ulong uStack_118;
  ValidityMask *pVStack_110;
  unsigned_long uStack_100;
  ulong uStack_f8;
  _Head_base<0UL,_unsigned_long_*,_false> _Stack_f0;
  _Head_base<0UL,_unsigned_long_*,_false> _Stack_e8;
  unsigned_long *puStack_e0;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *psStack_d8;
  Vector *pVStack_d0;
  ValidityMask *pVStack_c8;
  Vector *pVStack_c0;
  Vector *pVStack_b8;
  Vector *pVStack_b0;
  long *plStack_a8;
  Vector *pVStack_a0;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  idx_t local_80;
  long *local_78;
  ValidityMask *local_70;
  Vector *local_68;
  Vector *local_60;
  ValidityMask *local_58;
  buffer_ptr<ValidityBuffer> *local_50;
  ValidityMask *local_48;
  long *local_40;
  Vector *local_38;
  
  puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  pVVar25 = result_mask;
  local_70 = mask;
  local_68 = (Vector *)ldata;
  if (puVar3 == (unsigned_long *)0x0) {
    if (count != 0) {
      pVVar32 = (Vector *)&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
      pVVar30 = (Vector *)0x0;
      args = (Vector *)&local_80;
      vector = (Vector *)result_data;
      do {
        uVar24 = (ulong)(uint)*(int32_t *)(local_68 + (long)pVVar30 * 4);
        pVStack_a0 = (Vector *)0x643cb3;
        bVar15 = duckdb::Value::IsFinite<duckdb::date_t>
                           ((date_t)*(int32_t *)(local_68 + (long)pVVar30 * 4));
        if (bVar15) goto LAB_00643f8f;
        _Var17._M_head_impl =
             (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var17._M_head_impl == (unsigned_long *)0x0) {
          local_80 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          pVStack_a0 = (Vector *)0x643cd7;
          vector = args;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_98,(unsigned_long *)args);
          p_Var11 = p_Stack_90;
          peVar14 = local_98;
          local_98 = (element_type *)0x0;
          p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var4 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar14;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var11;
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            pVStack_a0 = (Vector *)0x643cf4;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
            if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              pVStack_a0 = (Vector *)0x643d03;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
          }
          pVStack_a0 = (Vector *)0x643d0b;
          pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               pVVar32);
          _Var17._M_head_impl =
               (pTVar16->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var17._M_head_impl;
        }
        bVar9 = (byte)pVVar30 & 0x3f;
        mask = (ValidityMask *)((ulong)pVVar30 >> 6);
        _Var17._M_head_impl[(long)mask] =
             _Var17._M_head_impl[(long)mask] & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
        result_data[(long)pVVar30] = 0;
        pVVar30 = pVVar30 + 1;
      } while ((Vector *)count != pVVar30);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      pVStack_a0 = (Vector *)0x643c4b;
      local_80 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_98,(unsigned_long **)mask,&local_80);
      p_Var11 = p_Stack_90;
      peVar14 = local_98;
      local_98 = (element_type *)0x0;
      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var4 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar14;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var11;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        pVStack_a0 = (Vector *)0x643c6e;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pVStack_a0 = (Vector *)0x643c7d;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
        }
      }
      pVStack_a0 = (Vector *)0x643c85;
      pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data)
      ;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar16->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      vector = (Vector *)mask;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar3;
      vector = (Vector *)&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
      pVStack_a0 = (Vector *)0x643d57;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)vector);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_58 = (ValidityMask *)(count + 0x3f >> 6);
      local_50 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
      mask = (ValidityMask *)0x0;
      pVVar30 = (Vector *)0x0;
      local_78 = result_data;
      local_60 = (Vector *)count;
      do {
        pVVar32 = local_68;
        puVar3 = (local_70->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        pVVar29 = (Vector *)count;
        local_48 = mask;
        if (puVar3 == (unsigned_long *)0x0) {
          args = pVVar30 + 0x40;
          if (count <= pVVar30 + 0x40) {
            args = (Vector *)count;
          }
LAB_00643de1:
          pVVar31 = pVVar30;
          if (pVVar30 < args) {
            do {
              uVar24 = (ulong)(uint)*(int32_t *)(pVVar32 + (long)pVVar30 * 4);
              pVStack_a0 = (Vector *)0x643df3;
              bVar15 = duckdb::Value::IsFinite<duckdb::date_t>
                                 ((date_t)*(int32_t *)(pVVar32 + (long)pVVar30 * 4));
              if (bVar15) goto LAB_00643f8f;
              _Var17._M_head_impl =
                   (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (_Var17._M_head_impl == (unsigned_long *)0x0) {
                local_80 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                vector = (Vector *)&local_80;
                pVStack_a0 = (Vector *)0x643e19;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_98,(unsigned_long *)vector);
                p_Var11 = p_Stack_90;
                peVar14 = local_98;
                local_98 = (element_type *)0x0;
                p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var4 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                         internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar14;
                (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var11;
                if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  pVStack_a0 = (Vector *)0x643e36;
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                  if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    pVStack_a0 = (Vector *)0x643e45;
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                  }
                }
                pVStack_a0 = (Vector *)0x643e4f;
                pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (local_50);
                _Var17._M_head_impl =
                     (pTVar16->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                     _Var17._M_head_impl;
              }
              bVar9 = (byte)pVVar30 & 0x3f;
              mask = (ValidityMask *)((ulong)pVVar30 >> 6);
              _Var17._M_head_impl[(long)mask] =
                   _Var17._M_head_impl[(long)mask] &
                   (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              result_data[(long)pVVar30] = 0;
              pVVar30 = pVVar30 + 1;
              pVVar31 = args;
            } while (args != pVVar30);
          }
        }
        else {
          plVar5 = (long *)puVar3[(long)mask];
          args = pVVar30 + 0x40;
          if (count <= pVVar30 + 0x40) {
            args = (Vector *)count;
          }
          pVVar31 = args;
          result_data = local_78;
          if (plVar5 != (long *)0x0) {
            if (plVar5 == (long *)0xffffffffffffffff) goto LAB_00643de1;
            count = (idx_t)(args + -(long)pVVar30);
            pVVar29 = local_60;
            pVVar31 = pVVar30;
            if (pVVar30 <= args && (Vector *)count != (Vector *)0x0) {
              local_40 = local_78 + (long)pVVar30;
              local_38 = local_68 + (long)pVVar30 * 4;
              pVVar32 = (Vector *)0x0;
              do {
                if (((ulong)plVar5 >> ((ulong)pVVar32 & 0x3f) & 1) != 0) {
                  uVar24 = (ulong)(uint)*(int32_t *)(local_38 + (long)pVVar32 * 4);
                  pVStack_a0 = (Vector *)0x643ecf;
                  bVar15 = duckdb::Value::IsFinite<duckdb::date_t>
                                     ((date_t)*(int32_t *)(local_38 + (long)pVVar32 * 4));
                  result_data = plVar5;
                  if (bVar15) goto LAB_00643f8f;
                  _Var17._M_head_impl =
                       (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                  if (_Var17._M_head_impl == (unsigned_long *)0x0) {
                    local_80 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                    vector = (Vector *)&local_80;
                    pVStack_a0 = (Vector *)0x643ef5;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_98,(unsigned_long *)vector);
                    p_Var11 = p_Stack_90;
                    peVar14 = local_98;
                    local_98 = (element_type *)0x0;
                    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var4 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data
                             .internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal
                    .
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar14;
                    (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal
                    .
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var11;
                    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      pVStack_a0 = (Vector *)0x643f12;
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                      if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        pVStack_a0 = (Vector *)0x643f21;
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                      }
                    }
                    pVStack_a0 = (Vector *)0x643f2b;
                    pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(local_50);
                    _Var17._M_head_impl =
                         (pTVar16->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         _Var17._M_head_impl;
                  }
                  bVar9 = (byte)(pVVar32 + (long)pVVar30) & 0x3f;
                  mask = (ValidityMask *)((ulong)(pVVar32 + (long)pVVar30) >> 6);
                  _Var17._M_head_impl[(long)mask] =
                       _Var17._M_head_impl[(long)mask] &
                       (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
                  local_40[(long)pVVar32] = 0;
                }
                pVVar32 = pVVar32 + 1;
                pVVar29 = local_60;
                pVVar31 = args;
                result_data = local_78;
              } while ((Vector *)count != pVVar32);
            }
          }
        }
        mask = (ValidityMask *)
               ((long)&(local_48->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1);
        count = (idx_t)pVVar29;
        pVVar30 = pVVar31;
      } while (mask != local_58);
    }
  }
  return;
LAB_00643f8f:
  pVStack_a0 = (Vector *)
               ExecuteLoop<duckdb::date_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneMinuteOperator>>
  ;
  DatePart::TimezoneMinuteOperator::Operation<duckdb::date_t,long>((date_t)(int32_t)uVar24);
  pVStack_d0 = vector;
  pVStack_c8 = result_mask;
  pVStack_c0 = (Vector *)count;
  pVStack_b8 = pVVar30;
  pVStack_b0 = pVVar32;
  plStack_a8 = result_data;
  pVStack_a0 = args;
  if (((__shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2> *)
      &(pVVar25->super_TemplatedValidityMask<unsigned_long>).validity_mask)->_M_ptr ==
      (element_type *)0x0) {
    if (extraout_RDX != 0) {
      uVar33 = *(unsigned_long *)&mask->super_TemplatedValidityMask<unsigned_long>;
      this = (ValidityMask *)((long)dataptr + 8);
      uVar22 = 0;
      p_Var28 = (_Head_base<0UL,_unsigned_long_*,_false> *)dataptr;
      do {
        uVar18 = uVar22;
        if (uVar33 != 0) {
          uVar18 = (ulong)*(uint *)(uVar33 + uVar22 * 4);
        }
        dVar2.days = *(int32_t *)(uVar24 + uVar18 * 4);
        pVVar32 = (Vector *)(ulong)(uint)dVar2.days;
        uStack_f8 = 0x644133;
        bVar15 = duckdb::Value::IsFinite<duckdb::date_t>(dVar2);
        adds_nulls_00 = SUB81(pVVar25,0);
        cVar27 = (char)p_Var28;
        if (bVar15) goto LAB_006441d2;
        _Var17._M_head_impl = ((_Head_base<0UL,_unsigned_long_*,_false> *)dataptr)->_M_head_impl;
        if (_Var17._M_head_impl == (unsigned_long *)0x0) {
          puStack_e0 = ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 0x18))->
                       _M_head_impl;
          vector = (Vector *)&puStack_e0;
          uStack_f8 = 0x644159;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&_Stack_f0,(unsigned_long *)vector);
          _Var13._M_head_impl = _Stack_e8._M_head_impl;
          _Var12._M_head_impl = _Stack_f0._M_head_impl;
          _Stack_f0._M_head_impl = (unsigned_long *)0x0;
          _Stack_e8._M_head_impl = (unsigned_long *)0x0;
          _Var17._M_head_impl =
               ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 0x10))->_M_head_impl;
          ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 8))->_M_head_impl =
               _Var12._M_head_impl;
          ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 0x10))->_M_head_impl =
               _Var13._M_head_impl;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var17._M_head_impl !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            uStack_f8 = 0x644176;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var17._M_head_impl);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_e8._M_head_impl !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              uStack_f8 = 0x644185;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_e8._M_head_impl);
            }
          }
          uStack_f8 = 0x64418d;
          pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               this);
          _Var17._M_head_impl =
               (pTVar16->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          ((_Head_base<0UL,_unsigned_long_*,_false> *)dataptr)->_M_head_impl = _Var17._M_head_impl;
        }
        bVar9 = (byte)uVar22 & 0x3f;
        mask = (ValidityMask *)(uVar22 >> 6);
        _Var17._M_head_impl[(long)mask] =
             _Var17._M_head_impl[(long)mask] & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
        *(undefined8 *)(pVStack_d0 + uVar22 * 8) = 0;
        uVar22 = uVar22 + 1;
      } while (extraout_RDX != uVar22);
    }
  }
  else if (extraout_RDX != 0) {
    uVar33 = *(unsigned_long *)&mask->super_TemplatedValidityMask<unsigned_long>;
    psStack_d8 = (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                 ((long)dataptr + 8);
    uVar22 = 0;
    pVVar26 = pVVar25;
    p_Var28 = (_Head_base<0UL,_unsigned_long_*,_false> *)dataptr;
    do {
      uVar18 = uVar22;
      if (uVar33 != 0) {
        uVar18 = (ulong)*(uint *)(uVar33 + uVar22 * 4);
      }
      mask = *(ValidityMask **)
              &((__shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 *)&(pVVar25->super_TemplatedValidityMask<unsigned_long>).validity_mask)->_M_ptr
               [uVar18 >> 6].owned_data.
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>;
      if (((ulong)mask >> (uVar18 & 0x3f) & 1) == 0) {
        _Var17._M_head_impl = ((_Head_base<0UL,_unsigned_long_*,_false> *)dataptr)->_M_head_impl;
        if (_Var17._M_head_impl == (unsigned_long *)0x0) {
          puStack_e0 = ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 0x18))->
                       _M_head_impl;
          vector = (Vector *)&puStack_e0;
          uStack_f8 = 0x6440a8;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&_Stack_f0,(unsigned_long *)vector);
          _Var13._M_head_impl = _Stack_e8._M_head_impl;
          _Var12._M_head_impl = _Stack_f0._M_head_impl;
          _Stack_f0._M_head_impl = (unsigned_long *)0x0;
          _Stack_e8._M_head_impl = (unsigned_long *)0x0;
          _Var17._M_head_impl =
               ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 0x10))->_M_head_impl;
          ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 8))->_M_head_impl =
               _Var12._M_head_impl;
          ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 0x10))->_M_head_impl =
               _Var13._M_head_impl;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var17._M_head_impl !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            uStack_f8 = 0x6440c5;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var17._M_head_impl);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_e8._M_head_impl !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              uStack_f8 = 0x6440d4;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_e8._M_head_impl);
            }
          }
          uStack_f8 = 0x6440de;
          pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (psStack_d8);
          _Var17._M_head_impl =
               (pTVar16->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          ((_Head_base<0UL,_unsigned_long_*,_false> *)dataptr)->_M_head_impl = _Var17._M_head_impl;
        }
        bVar9 = (byte)uVar22 & 0x3f;
        _Var17._M_head_impl[uVar22 >> 6] =
             _Var17._M_head_impl[uVar22 >> 6] & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9)
        ;
      }
      else {
        dVar2.days = *(int32_t *)(uVar24 + uVar18 * 4);
        pVVar32 = (Vector *)(ulong)(uint)dVar2.days;
        uStack_f8 = 0x644002;
        bVar15 = duckdb::Value::IsFinite<duckdb::date_t>(dVar2);
        adds_nulls_00 = SUB81(pVVar26,0);
        cVar27 = (char)p_Var28;
        this = pVVar25;
        if (bVar15) {
LAB_006441d2:
          uStack_f8 = 0x6441d7;
          DatePart::TimezoneMinuteOperator::Operation<duckdb::date_t,long>((date_t)(int32_t)pVVar32)
          ;
          VVar1 = *pVVar32;
          VVar23 = (VectorType)vector;
          p_Stack_120 = (_Head_base<0UL,_unsigned_long_*,_false> *)dataptr;
          uStack_118 = uVar24;
          pVStack_110 = this;
          uStack_100 = uVar33;
          uStack_f8 = uVar22;
          if (VVar1 == (Vector)0x0) {
            duckdb::Vector::SetVectorType(VVar23);
            plVar5 = *(long **)(vector + 0x20);
            ptVar8 = *(timestamp_t **)(pVVar32 + 0x20);
            FlatVector::VerifyFlatVector(pVVar32);
            FlatVector::VerifyFlatVector(vector);
            ExecuteFlat<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneMinuteOperator>>
                      (ptVar8,plVar5,(idx_t)count_00,(ValidityMask *)(pVVar32 + 0x28),
                       (ValidityMask *)(vector + 0x28),mask,(bool)adds_nulls_00);
          }
          else {
            if (VVar1 == (Vector)0x3) {
              if (cVar27 == '\0') {
                DictionaryVector::VerifyDictionary(pVVar32);
                pVVar19 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                                    ((shared_ptr<duckdb::VectorBuffer,_true> *)(pVVar32 + 0x48));
                oStack_178.index = *(idx_t *)(pVVar19 + 0x48);
                if (((SelectionVector *)oStack_178.index != (SelectionVector *)0xffffffffffffffff)
                   && (iVar20 = optional_idx::GetIndex(&oStack_178),
                      (UnifiedVectorFormat *)(iVar20 * 2) <= count_00)) {
                  DictionaryVector::VerifyDictionary(pVVar32);
                  pVVar19 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                                      ((shared_ptr<duckdb::VectorBuffer,_true> *)(pVVar32 + 0x58));
                  if (pVVar19[0x30] == (VectorBuffer)0x0) {
                    plVar5 = *(long **)(vector + 0x20);
                    ptVar8 = *(timestamp_t **)(pVVar19 + 0x50);
                    iVar20 = optional_idx::GetIndex(&oStack_178);
                    FlatVector::VerifyFlatVector((Vector *)(pVVar19 + 0x30));
                    FlatVector::VerifyFlatVector(vector);
                    ExecuteFlat<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneMinuteOperator>>
                              (ptVar8,plVar5,iVar20,(ValidityMask *)(pVVar19 + 0x58),
                               (ValidityMask *)(vector + 0x28),mask,(bool)adds_nulls_00);
                    DictionaryVector::VerifyDictionary(pVVar32);
                    pVVar19 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                                        ((shared_ptr<duckdb::VectorBuffer,_true> *)(pVVar32 + 0x48))
                    ;
                    pSVar21 = (SelectionVector *)optional_idx::GetIndex(&oStack_178);
                    duckdb::Vector::Dictionary(vector,(ulong)vector,pSVar21,(ulong)(pVVar19 + 0x30))
                    ;
                    return;
                  }
                }
              }
            }
            else if (VVar1 == (Vector)0x2) {
              duckdb::Vector::SetVectorType(VVar23);
              puVar6 = *(undefined8 **)(vector + 0x20);
              piVar7 = *(int64_t **)(pVVar32 + 0x20);
              if ((*(byte **)(pVVar32 + 0x28) != (byte *)0x0) &&
                 ((**(byte **)(pVVar32 + 0x28) & 1) == 0)) {
                duckdb::ConstantVector::SetNull(vector,true);
                return;
              }
              duckdb::ConstantVector::SetNull(vector,false);
              bVar15 = duckdb::Value::IsFinite<duckdb::timestamp_t>((timestamp_t)*piVar7);
              if (!bVar15) {
                _Var17._M_head_impl = *(unsigned_long **)(vector + 0x28);
                if (_Var17._M_head_impl == (unsigned_long *)0x0) {
                  uStack_128 = *(unsigned_long *)(vector + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&oStack_178,&uStack_128);
                  p_Var11 = p_Stack_170;
                  oVar10.index = oStack_178.index;
                  oStack_178.index = 0;
                  p_Stack_170 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(vector + 0x38);
                  *(idx_t *)(vector + 0x30) = oVar10.index;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(vector + 0x38) = p_Var11;
                  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                     p_Stack_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_170);
                  }
                  pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)(vector + 0x30));
                  _Var17._M_head_impl =
                       (pTVar16->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)(vector + 0x28) = _Var17._M_head_impl;
                }
                *(byte *)_Var17._M_head_impl = (byte)*_Var17._M_head_impl & 0xfe;
              }
              *puVar6 = 0;
              return;
            }
            duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&oStack_178);
            duckdb::Vector::ToUnifiedFormat((ulong)pVVar32,count_00);
            duckdb::Vector::SetVectorType(VVar23);
            oVar10.index = oStack_178.index;
            plVar5 = *(long **)(vector + 0x20);
            FlatVector::VerifyFlatVector(vector);
            ExecuteLoop<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneMinuteOperator>>
                      ((timestamp_t *)p_Stack_170,plVar5,(idx_t)count_00,
                       (SelectionVector *)oVar10.index,&VStack_168,(ValidityMask *)(vector + 0x28),
                       mask,(bool)adds_nulls_00);
            if (p_Stack_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_138);
            }
            if (VStack_168.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (VStack_168.super_TemplatedValidityMask<unsigned_long>.validity_data.
                         internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
          }
          return;
        }
        _Var17._M_head_impl = ((_Head_base<0UL,_unsigned_long_*,_false> *)dataptr)->_M_head_impl;
        if (_Var17._M_head_impl == (unsigned_long *)0x0) {
          puStack_e0 = ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 0x18))->
                       _M_head_impl;
          vector = (Vector *)&puStack_e0;
          uStack_f8 = 0x644028;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&_Stack_f0,(unsigned_long *)vector);
          _Var13._M_head_impl = _Stack_e8._M_head_impl;
          _Var12._M_head_impl = _Stack_f0._M_head_impl;
          _Stack_f0._M_head_impl = (unsigned_long *)0x0;
          _Stack_e8._M_head_impl = (unsigned_long *)0x0;
          _Var17._M_head_impl =
               ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 0x10))->_M_head_impl;
          ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 8))->_M_head_impl =
               _Var12._M_head_impl;
          ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 0x10))->_M_head_impl =
               _Var13._M_head_impl;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var17._M_head_impl !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            uStack_f8 = 0x644045;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var17._M_head_impl);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_e8._M_head_impl !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              uStack_f8 = 0x644054;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_e8._M_head_impl);
            }
          }
          uStack_f8 = 0x64405e;
          pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (psStack_d8);
          _Var17._M_head_impl =
               (pTVar16->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          ((_Head_base<0UL,_unsigned_long_*,_false> *)dataptr)->_M_head_impl = _Var17._M_head_impl;
        }
        bVar9 = (byte)uVar22 & 0x3f;
        _Var17._M_head_impl[uVar22 >> 6] =
             _Var17._M_head_impl[uVar22 >> 6] & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9)
        ;
        *(undefined8 *)(pVStack_d0 + uVar22 * 8) = 0;
      }
      uVar22 = uVar22 + 1;
    } while (extraout_RDX != uVar22);
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}